

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::DecodeBase58Request,cfd::js::api::json::DecodeBase58Response,cfd::js::api::DecodeBase58RequestStruct,cfd::js::api::DecodeBase58ResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
          *call_function)

{
  ErrorResponse local_4e0;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_428 [4];
  JsonClassBase<cfd::js::api::json::DecodeBase58Response> local_408 [4];
  undefined1 local_3e8 [8];
  DecodeBase58Response res_2;
  undefined1 local_388 [8];
  DecodeBase58ResponseStruct response;
  DecodeBase58RequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_80 [8];
  DecodeBase58Request req;
  function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._88_8_ = call_function;
  DecodeBase58Request::DecodeBase58Request((DecodeBase58Request *)local_80);
  core::JsonClassBase<cfd::js::api::json::DecodeBase58Request>::Deserialize
            ((JsonClassBase<cfd::js::api::json::DecodeBase58Request> *)local_80,request_message);
  DecodeBase58Request::ConvertToStruct
            ((DecodeBase58RequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (DecodeBase58Request *)local_80);
  std::
  function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
  ::operator()((DecodeBase58ResponseStruct *)local_388,call_function,
               (DecodeBase58RequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    DecodeBase58Response::DecodeBase58Response((DecodeBase58Response *)local_3e8);
    DecodeBase58Response::ConvertFromStruct
              ((DecodeBase58Response *)local_3e8,(DecodeBase58ResponseStruct *)local_388);
    core::JsonClassBase<cfd::js::api::json::DecodeBase58Response>::Serialize_abi_cxx11_(local_408);
    std::__cxx11::string::operator=((string *)this,(string *)local_408);
    std::__cxx11::string::~string((string *)local_408);
    DecodeBase58Response::~DecodeBase58Response((DecodeBase58Response *)local_3e8);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_4e0,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_428);
    std::__cxx11::string::operator=((string *)this,(string *)local_428);
    std::__cxx11::string::~string((string *)local_428);
    ErrorResponse::~ErrorResponse(&local_4e0);
  }
  res_2._87_1_ = 1;
  DecodeBase58ResponseStruct::~DecodeBase58ResponseStruct((DecodeBase58ResponseStruct *)local_388);
  DecodeBase58RequestStruct::~DecodeBase58RequestStruct
            ((DecodeBase58RequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  DecodeBase58Request::~DecodeBase58Request((DecodeBase58Request *)local_80);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}